

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall asl::HttpServer::serve(HttpServer *this,Socket *client)

{
  WebSocketServer *pWVar1;
  undefined4 uVar2;
  Dic<asl::String> *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  HttpRequest *pHVar8;
  File *pFVar9;
  String *s;
  anon_union_16_2_78e7fdac_for_String_2 *paVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  double dVar13;
  String range;
  String mime;
  Array<asl::String> parts;
  String hconn;
  File file;
  HttpResponse response;
  HttpRequest request;
  String local_2e8;
  String local_2d0;
  String local_2b8;
  String local_2a0;
  undefined1 local_288 [16];
  anon_union_16_2_78e7fdac_for_String_2 local_278;
  undefined1 local_268 [8];
  String local_260 [2];
  HttpResponse local_220;
  Dic<asl::String> *local_198;
  String *local_190;
  double local_188;
  HttpRequest local_180;
  
  local_188 = now();
  iVar5 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])();
  if ((char)iVar5 == '\0') {
    local_190 = &this->_methods;
    local_198 = &this->_mimetypes;
    do {
      dVar13 = now();
      if (10.0 <= dVar13 - local_188) {
        return;
      }
      if ((this->super_SocketServer)._requestStop != false) {
        return;
      }
      iVar5 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xf])(0x4014000000000000);
      if (((char)iVar5 != '\0') &&
         (iVar5 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])(), (char)iVar5 == '\0')
         ) {
        HttpRequest::HttpRequest(&local_180,client);
        if (((client->super_SmartObject)._p[3].rc.n != 0) ||
           (((local_180._method._len < 1 || (local_180._path._len < 1)) ||
            (local_180.super_HttpMessage._proto._len < 1)))) {
          HttpRequest::~HttpRequest(&local_180);
          return;
        }
        String::String((String *)local_268,"Connection");
        HttpMessage::header((String *)&local_220,&local_180.super_HttpMessage,(String *)local_268);
        String::toLowerCase((String *)(local_288 + 8),(String *)&local_220);
        if (local_220.super_HttpMessage._command._size != 0) {
          free(local_220.super_HttpMessage._command.field_2._str);
        }
        if (local_268._0_4_ != 0) {
          free((void *)local_260[0]._0_8_);
        }
        String::String((String *)local_268,"Upgrade");
        HttpMessage::header((String *)&local_220,&local_180.super_HttpMessage,(String *)local_268);
        uVar11 = local_220.super_HttpMessage._command.field_2._str;
        iVar5 = local_220.super_HttpMessage._command._size;
        uVar12 = local_220.super_HttpMessage._command.field_2._str;
        if (local_220.super_HttpMessage._command._size == 0) {
          uVar12 = &local_220.super_HttpMessage._command.field_2;
        }
        iVar6 = strcmp((char *)uVar12,"websocket");
        if (iVar6 == 0) {
          pWVar1 = this->_wsserver;
          if (iVar5 != 0) {
            free((void *)uVar11);
          }
          if (local_268._0_4_ != 0) {
            free((void *)local_260[0]._0_8_);
          }
          if (pWVar1 == (WebSocketServer *)0x0) goto LAB_0011fd7f;
          if (verbose == '\x01') {
            puts("handing over to ws");
          }
          bVar4 = true;
          WebSocketServer::process(this->_wsserver,client,&local_180.super_HttpMessage._headers);
        }
        else {
          if (iVar5 != 0) {
            free((void *)uVar11);
          }
          if (local_268._0_4_ != 0) {
            free((void *)local_260[0]._0_8_);
          }
LAB_0011fd7f:
          HttpResponse::HttpResponse(&local_220,&local_180);
          if (this->_cors == true) {
            String::String((String *)local_268,"Origin");
            bVar4 = HttpMessage::hasHeader(&local_180.super_HttpMessage,(String *)local_268);
            if (local_268._0_4_ != 0) {
              free((void *)local_260[0]._0_8_);
            }
            if (bVar4) {
              String::String((String *)local_268,"Access-Control-Allow-Origin");
              String::String(&local_2e8,"Origin");
              HttpMessage::header(&local_2b8,&local_180.super_HttpMessage,&local_2e8);
              HttpMessage::setHeader(&local_220.super_HttpMessage,(String *)local_268,&local_2b8);
              if (local_2b8._size != 0) {
                free(local_2b8.field_2._str);
              }
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              if (local_268._0_4_ != 0) {
                free((void *)local_260[0]._0_8_);
              }
              String::String((String *)local_268,"Access-Control-Allow-Credentials");
              String::String(&local_2b8,"true");
              HttpMessage::setHeader(&local_220.super_HttpMessage,(String *)local_268,&local_2b8);
              if (local_2b8._size != 0) {
                free(local_2b8.field_2._str);
              }
              if (local_268._0_4_ != 0) {
                free((void *)local_260[0]._0_8_);
              }
            }
          }
          uVar11 = &local_278;
          if (local_288._8_4_ != 0) {
            uVar11 = local_278._str;
          }
          iVar5 = strcmp((char *)uVar11,"keep-alive");
          if (iVar5 == 0) {
            String::String((String *)local_268,"Connection");
            String::String(&local_2b8,"keep-alive");
            HttpMessage::setHeader(&local_220.super_HttpMessage,(String *)local_268,&local_2b8);
            if (local_2b8._size != 0) {
              free(local_2b8.field_2._str);
            }
            if (local_268._0_4_ != 0) {
              free((void *)local_260[0]._0_8_);
            }
          }
          iVar5 = (*(this->super_SocketServer)._vptr_SocketServer[2])(this,&local_180,&local_220);
          if ((char)iVar5 == '\0') {
            pHVar8 = &local_180;
            (*(this->super_SocketServer)._vptr_SocketServer[1])(this,&local_180,&local_220);
            iVar5 = (int)pHVar8;
            __buf = extraout_RDX;
            if (*(int *)(local_220.super_HttpMessage._body._a + -0x10) == 0) {
              iVar5 = 0x1411b7;
              HttpMessage::put(&local_220.super_HttpMessage,"");
              __buf = extraout_RDX_00;
            }
            if (local_220._code == 0x195) {
              String::String((String *)local_268,"Allow");
              pFVar9 = (File *)local_268;
              HttpMessage::setHeader(&local_220.super_HttpMessage,(String *)local_268,local_190);
              iVar5 = (int)pFVar9;
              __buf = extraout_RDX_01;
              if (local_268._0_4_ != 0) {
                free((void *)local_260[0]._0_8_);
                __buf = extraout_RDX_02;
              }
            }
            if (local_220.super_HttpMessage._fileBody != true) {
              HttpMessage::write(&local_220.super_HttpMessage,iVar5,__buf,in_RCX);
              goto LAB_0012058e;
            }
            HttpMessage::text(&local_2b8,&local_220.super_HttpMessage);
            File::File((File *)local_268,&local_2b8);
            if (local_2b8._size != 0) {
              free(local_2b8.field_2._str);
            }
            bVar4 = File::isFile((File *)local_268);
            if (bVar4) {
              File::extension(&local_2e8,(File *)local_268);
              String::String(&local_2d0,"text/plain");
              pDVar3 = local_198;
              uVar7 = Map<asl::String,_asl::String>::indexOf
                                (&local_198->super_Map<asl::String,_asl::String>,&local_2e8);
              s = &(pDVar3->super_Map<asl::String,_asl::String>).a._a[uVar7].value;
              if ((int)uVar7 < 0) {
                s = &local_2d0;
              }
              String::String(&local_2b8,s);
              if (local_2d0._size != 0) {
                free(local_2d0.field_2._str);
              }
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              String::String(&local_2e8,"Date");
              Date::now();
              in_RCX = 0;
              Date::toString(&local_2d0,(Date *)&local_2a0,HTTP,false);
              HttpMessage::setHeader(&local_220.super_HttpMessage,&local_2e8,&local_2d0);
              if (local_2d0._size != 0) {
                free(local_2d0.field_2._str);
              }
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              String::String(&local_2e8,"Content-Type");
              bVar4 = HttpMessage::hasHeader(&local_220.super_HttpMessage,&local_2e8);
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              if (!bVar4) {
                String::String(&local_2e8,"Content-Type");
                HttpMessage::setHeader(&local_220.super_HttpMessage,&local_2e8,&local_2b8);
                if (local_2e8._size != 0) {
                  free(local_2e8.field_2._str);
                }
              }
              String::String(&local_2e8,"Cache-Control");
              bVar4 = HttpMessage::hasHeader(&local_220.super_HttpMessage,&local_2e8);
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              if (!bVar4) {
                String::String(&local_2e8,"Cache-Control");
                String::String(&local_2d0,"max-age=60, public");
                HttpMessage::setHeader(&local_220.super_HttpMessage,&local_2e8,&local_2d0);
                if (local_2d0._size != 0) {
                  free(local_2d0.field_2._str);
                }
                if (local_2e8._size != 0) {
                  free(local_2e8.field_2._str);
                }
              }
              String::String(&local_2e8,"Range");
              bVar4 = HttpMessage::hasHeader(&local_180.super_HttpMessage,&local_2e8);
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              if (bVar4) {
                String::String(&local_2d0,"Range");
                HttpMessage::header(&local_2e8,&local_180.super_HttpMessage,&local_2d0);
                if (local_2d0._size != 0) {
                  free(local_2d0.field_2._str);
                }
                bVar4 = String::startsWith(&local_2e8,"bytes=");
                if ((bVar4) && (iVar5 = String::indexOf(&local_2e8,',',0), iVar5 < 0)) {
                  String::substr(&local_2d0,&local_2e8,6,local_2e8._len);
                  local_2a0._size = 0;
                  local_2a0._len = 1;
                  local_2a0.field_2._0_2_ = 0x2d;
                  String::split((String *)local_288,&local_2d0);
                  if (local_2a0._size != 0) {
                    free((void *)CONCAT62(local_2a0.field_2._2_6_,local_2a0.field_2._0_2_));
                  }
                  if (local_2d0._size != 0) {
                    free(local_2d0.field_2._str);
                  }
                  if (*(int *)local_288._0_8_ == 0) {
                    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(local_288._0_8_ + 8);
                  }
                  else {
                    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)
                              ((anon_union_16_2_78e7fdac_for_String_2 *)(local_288._0_8_ + 8))->_str
                    ;
                  }
                  iVar5 = myatoi(paVar10->_space);
                  if (((String *)(local_288._0_8_ + 0x18))->_size == 0) {
                    paVar10 = &((String *)(local_288._0_8_ + 0x18))->field_2;
                  }
                  else {
                    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)
                              (((String *)(local_288._0_8_ + 0x18))->field_2)._str;
                  }
                  uVar7 = myatoi(paVar10->_space);
                  HttpResponse::setCode(&local_220,0xce);
                  String::String(&local_2d0,"Content-Range");
                  String::String(&local_2a0,"+");
                  HttpMessage::setHeader(&local_220.super_HttpMessage,&local_2d0,&local_2a0);
                  if (local_2a0._size != 0) {
                    free((void *)CONCAT62(local_2a0.field_2._2_6_,local_2a0.field_2._0_2_));
                  }
                  if (local_2d0._size != 0) {
                    free(local_2d0.field_2._str);
                  }
                  in_RCX = (size_t)uVar7;
                  HttpMessage::putFile(&local_220.super_HttpMessage,local_260,iVar5,uVar7);
                  Array<asl::String>::~Array((Array<asl::String> *)local_288);
                }
                if (local_2e8._size != 0) {
                  free(local_2e8.field_2._str);
                }
              }
              else {
                in_RCX = 0;
                HttpMessage::putFile(&local_220.super_HttpMessage,local_260,0,0);
              }
              String::String(&local_2e8,"Content-Range");
              bVar4 = HttpMessage::hasHeader(&local_220.super_HttpMessage,&local_2e8);
              if (bVar4) {
                String::String(&local_2a0,"Content-Range");
                HttpMessage::header(&local_2d0,&local_220.super_HttpMessage,&local_2a0);
                iVar5 = String::indexOf(&local_2d0,'*',0);
                bVar4 = -1 < iVar5;
                if (local_2d0._size != 0) {
                  free(local_2d0.field_2._str);
                }
                if (local_2a0._size != 0) {
                  free((void *)CONCAT62(local_2a0.field_2._2_6_,local_2a0.field_2._0_2_));
                }
              }
              else {
                bVar4 = false;
              }
              if (local_2e8._size != 0) {
                free(local_2e8.field_2._str);
              }
              if (bVar4) {
                iVar5 = 0x1a0;
                HttpResponse::setCode(&local_220,0x1a0);
                HttpMessage::write(&local_220.super_HttpMessage,iVar5,__buf_01,in_RCX);
              }
              if (local_2b8._size != 0) {
                free(local_2b8.field_2._str);
              }
              File::~File((File *)local_268);
              goto LAB_0012058e;
            }
            HttpResponse::setCode(&local_220,0x194);
            String::String(&local_2b8,"Content-Type");
            String::String(&local_2e8,"text/plain");
            HttpMessage::setHeader(&local_220.super_HttpMessage,&local_2b8,&local_2e8);
            if (local_2e8._size != 0) {
              free(local_2e8.field_2._str);
            }
            if (local_2b8._size != 0) {
              free(local_2b8.field_2._str);
            }
            iVar5 = 0x1403b6;
            HttpMessage::put(&local_220.super_HttpMessage,"Not found");
            HttpMessage::write(&local_220.super_HttpMessage,iVar5,__buf_00,in_RCX);
            File::~File((File *)local_268);
            bVar4 = false;
          }
          else {
LAB_0012058e:
            uVar11 = &local_180.super_HttpMessage._proto.field_2;
            if (local_180.super_HttpMessage._proto._size != 0) {
              uVar11 = local_180.super_HttpMessage._proto.field_2._str;
            }
            iVar5 = strcmp((char *)uVar11,"HTTP/1.0");
            uVar11 = local_278._str;
            uVar2 = local_288._8_4_;
            if (iVar5 == 0) {
              uVar12 = local_278._str;
              if (local_288._8_4_ == 0) {
                uVar12 = &local_278;
              }
              iVar5 = strcmp((char *)uVar12,"keep-alive");
              bVar4 = true;
              if (iVar5 != 0) goto LAB_0012060d;
            }
            if (uVar2 == 0) {
              uVar11 = &local_278;
            }
            iVar5 = strcmp((char *)uVar11,"close");
            bVar4 = iVar5 == 0;
            in_RCX = (size_t)bVar4;
          }
LAB_0012060d:
          HttpMessage::~HttpMessage(&local_220.super_HttpMessage);
        }
        if (local_288._8_4_ != 0) {
          free(local_278._str);
        }
        HttpRequest::~HttpRequest(&local_180);
        if (bVar4) {
          return;
        }
      }
      iVar5 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])();
    } while ((char)iVar5 == '\0');
  }
  return;
}

Assistant:

void HttpServer::serve(Socket client)
{
	double t1 = now();
	while(client.connected() && now() - t1 < 10.0 && !_requestStop)
	{
		if (!client.waitData(5))
			continue;

		HttpRequest request(client);
		if (client.error() || !request.method().ok() || !request.path().ok() || !request.protocol().ok())
			break;

		String hconn = request.header("Connection").toLowerCase();

		if (request.header("Upgrade") == "websocket" && _wsserver)
		{
			if(verbose) printf("handing over to ws\n");
			_wsserver->process(client, request.headers());
			return;
		}

		HttpResponse response(request);

		if (_cors && request.hasHeader("Origin"))
		{
			response.setHeader("Access-Control-Allow-Origin", request.header("Origin"));
			response.setHeader("Access-Control-Allow-Credentials", "true");
		}

		if (hconn == "keep-alive")
			response.setHeader("Connection", "keep-alive");

		if (!handleOptions(request, response))
		{
			serve(request, response);

			if (!response.body())
				response.put("");

			if (response.code() == 405)
				response.setHeader("Allow", _methods);

			if (response.containsFile())
			{
				File file(response.text());
				if (!file.isFile())
				{
					response.setCode(404);
					response.setHeader("Content-Type", "text/plain");
					response.put("Not found");
					response.write();
					continue;
				}

				String mime = _mimetypes.get(file.extension(), "text/plain");
				response.setHeader("Date", Date::now().toString(Date::HTTP));
				if (!response.hasHeader("Content-Type"))
					response.setHeader("Content-Type", mime);
				
				if (!response.hasHeader("Cache-Control"))
					response.setHeader("Cache-Control", "max-age=60, public");
				
				if (request.hasHeader("Range"))
				{
					String range = request.header("Range");
					if (range.startsWith("bytes=") && !range.contains(',')) // no multiple ranges
					{
						Array<String> parts = range.substr(6).split('-');
						int begin = parts[0];
						int end = parts[1];
						response.setCode(206);
						response.setHeader("Content-Range", "+");
						response.putFile(file.path(), begin, end);
					}
				}
				else
					response.putFile(file.path());

				if (response.hasHeader("Content-Range") && response.header("Content-Range").contains('*'))
				{
					response.setCode(416);
					response.write();
				}
			}
			else
				response.write();
		}
		
		if ((request.protocol() == "HTTP/1.0" && hconn != "keep-alive") || hconn == "close")
			break;
	}
}